

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O0

void __thiscall CVmMemorySourceList::CVmMemorySourceList(CVmMemorySourceList *this,long init_len)

{
  long in_RSI;
  undefined8 *in_RDI;
  CVmMemorySourceList *in_stack_00000010;
  long local_10;
  
  CVmRefCntObj::CVmRefCntObj((CVmRefCntObj *)0x2c813c);
  *in_RDI = &PTR__CVmMemorySourceList_003e0588;
  in_RDI[6] = 0;
  in_RDI[5] = 0;
  add_block(in_stack_00000010);
  in_RDI[2] = in_RDI[5];
  in_RDI[3] = 0;
  for (local_10 = in_RSI + -0x1000; 0 < local_10; local_10 = local_10 + -0x1000) {
    add_block(in_stack_00000010);
  }
  in_RDI[4] = 0;
  return;
}

Assistant:

CVmMemorySourceList(long init_len)
    {
        /* no blocks yet */
        first_block_ = last_block_ = 0;

        /* always allocate at least the initial block */
        add_block();
        init_len -= BlockLen;

        /* set the seek position to the start of the first block */
        cur_block_ = first_block_;
        cur_block_ofs_ = 0;

        /* add more blocks until we've satisfied the length request */
        for ( ; init_len > 0 ; init_len -= BlockLen)
            add_block();

        /* the file is currently empty */
        len_ = 0;
    }